

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_component.cpp
# Opt level: O3

void __thiscall
lsim::ModelComponent::ModelComponent
          (ModelComponent *this,ModelCircuit *parent,uint32_t id,char *circuit_name,uint32_t inputs,
          uint32_t outputs)

{
  allocator local_21;
  
  this->m_circuit = parent;
  this->m_id = id;
  this->m_type = 0x301;
  this->m_inputs = inputs;
  this->m_outputs = outputs;
  this->m_controls = 0;
  std::__cxx11::string::string((string *)&this->m_nested_name,circuit_name,&local_21);
  this->m_nested_circuit = (ModelCircuit *)0x0;
  (this->m_port_lut)._M_h._M_buckets = &(this->m_port_lut)._M_h._M_single_bucket;
  (this->m_port_lut)._M_h._M_bucket_count = 1;
  (this->m_port_lut)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_port_lut)._M_h._M_element_count = 0;
  (this->m_port_lut)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_port_lut)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_port_lut)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_properties)._M_h._M_buckets = &(this->m_properties)._M_h._M_single_bucket;
  (this->m_properties)._M_h._M_bucket_count = 1;
  (this->m_properties)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_properties)._M_h._M_element_count = 0;
  (this->m_properties)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_properties)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_properties)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Point::Point(&this->m_position,0.0,0.0);
  this->m_angle = 0;
  return;
}

Assistant:

ModelComponent::ModelComponent(ModelCircuit *parent, uint32_t id, const char *circuit_name, uint32_t inputs, uint32_t outputs) :
        m_circuit(parent),
        m_id(id),
        m_type(COMPONENT_SUB_CIRCUIT),
        m_inputs(inputs),
        m_outputs(outputs),
        m_controls(0),
        m_nested_name(circuit_name),
        m_nested_circuit(nullptr),
        m_position(0,0),
        m_angle(0) {
}